

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntMap.h
# Opt level: O3

void __thiscall
Minisat::IntSet<Minisat::Lit,_Minisat::MkIndexLit>::clear
          (IntSet<Minisat::Lit,_Minisat::MkIndexLit> *this,bool free)

{
  int iVar1;
  char *__ptr;
  Lit *__ptr_00;
  long lVar2;
  undefined7 in_register_00000031;
  
  if ((int)CONCAT71(in_register_00000031,free) == 0) {
    if ((this->xs).sz < 1) {
      if ((this->xs).data == (Lit *)0x0) {
        return;
      }
      (this->xs).sz = 0;
      return;
    }
    lVar2 = 0;
    do {
      iVar1 = (this->xs).data[lVar2].x;
      if ((this->in_set).map.sz <= iVar1) {
        __assert_fail("has(k)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/luciferxiaozhi[P]VertexCover_CNFSAT_/minisat/minisat/mtl/IntMap.h"
                      ,0x28,
                      "V &Minisat::IntMap<Minisat::Lit, char, Minisat::MkIndexLit>::operator[](K) [K = Minisat::Lit, V = char, MkIndex = Minisat::MkIndexLit]"
                     );
      }
      (this->in_set).map.data[iVar1] = '\0';
      lVar2 = lVar2 + 1;
    } while (lVar2 < (this->xs).sz);
  }
  else {
    __ptr = (this->in_set).map.data;
    if (__ptr != (char *)0x0) {
      (this->in_set).map.sz = 0;
      ::free(__ptr);
      (this->in_set).map.data = (char *)0x0;
      (this->in_set).map.cap = 0;
    }
  }
  __ptr_00 = (this->xs).data;
  if ((__ptr_00 != (Lit *)0x0) && ((this->xs).sz = 0, free)) {
    ::free(__ptr_00);
    (this->xs).data = (Lit *)0x0;
    (this->xs).cap = 0;
  }
  return;
}

Assistant:

void     clear       (bool free = false){
            if (free)
                in_set.clear(true); 
            else
                for (int i = 0; i < xs.size(); i++)
                    in_set[xs[i]] = 0;
            xs.clear(free);
        }